

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfttest.cc
# Opt level: O1

void test::perft::testPosition(string *token,Board *pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type __n;
  pointer *__ptr_2;
  pointer *__ptr;
  int iVar7;
  char *in_R9;
  ulong __val;
  uint __len;
  string __str;
  AssertionResult gtest_ar_;
  string target;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  string local_80;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  iVar7 = (token->_M_dataplus)._M_p[1] + -0x30;
  std::__cxx11::string::find((char)token,0x20);
  std::__cxx11::string::substr((ulong)&local_48,(ulong)token);
  uVar4 = countMoves(iVar7,pos);
  utils::getTimestamp_abi_cxx11_();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," D",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  __val = -uVar4;
  if (0 < (long)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00108aea;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00108aea;
      }
      if (uVar6 < 10000) goto LAB_00108aea;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00108aea:
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)__len - (char)((long)uVar4 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_80._M_dataplus._M_p + -((long)uVar4 >> 0x3f),__len,__val);
  __n = local_40;
  if (local_80._M_string_length < local_40) {
    __n = local_80._M_string_length;
  }
  if (__n != 0) {
    iVar7 = bcmp(local_48,local_80._M_dataplus._M_p,__n);
    if (iVar7 != 0) {
      local_58[0] = (internal)0x0;
      goto LAB_00108b4d;
    }
  }
  local_58[0] = (internal)(local_40 == local_80._M_string_length);
LAB_00108b4d:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,local_58,(AssertionResult *)"target.compare(std::to_string(nodes)) == 0",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/test/perfttest/perfttest.cc"
               ,0x3b,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void test::perft::testPosition(const std::string& token, board::Board& pos)
{
    int depth = token[1] - '0';
    std::string target = token.substr(token.find(' ') + 1, token.length());
    int64_t nodes = countMoves(depth, pos);
    std::cout << utils::getTimestamp() << " D" << depth << " " << nodes << std::endl;
    ASSERT_TRUE(target.compare(std::to_string(nodes)) == 0);
}